

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIPSolution.cpp
# Opt level: O0

shared_ptr<JointPolicy> __thiscall BGIPSolution::GetJointPolicy(BGIPSolution *this)

{
  size_t sVar1;
  shared_ptr<JPPVValuePair> *this_00;
  undefined8 uVar2;
  size_type sVar3;
  const_reference this_01;
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  shared_count sVar4;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<JointPolicyPureVector> sVar5;
  shared_ptr<JointPolicy> sVar6;
  JPPVValuePair *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffffb8;
  E *in_stack_ffffffffffffffc0;
  undefined1 local_20 [32];
  
  if ((*(byte *)(in_RSI + 0x20) & 1) == 0) {
    sVar3 = std::
            priority_queue<boost::shared_ptr<JPPVValuePair>,_std::vector<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
            ::size((priority_queue<boost::shared_ptr<JPPVValuePair>,_std::vector<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
                    *)0x8d0aea);
    if (sVar3 == 0) {
      uVar2 = __cxa_allocate_exception(0x28);
      E::E(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      __cxa_throw(uVar2,&E::typeinfo,E::~E);
    }
    this_01 = std::
              priority_queue<boost::shared_ptr<JPPVValuePair>,_std::vector<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
              ::top((priority_queue<boost::shared_ptr<JPPVValuePair>,_std::vector<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
                     *)0x8d0afe);
    boost::shared_ptr<JPPVValuePair>::operator->(this_01);
    sVar5 = JPPVValuePair::GetJPPV(in_stack_ffffffffffffff88);
    boost::shared_ptr<JointPolicy>::shared_ptr<JointPolicyPureVector>
              ((shared_ptr<JointPolicy> *)in_RDI,&stack0xffffffffffffffb8,sVar5.pn.pi_.pi_);
    boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
              ((shared_ptr<JointPolicyPureVector> *)0x8d0b2c);
    sVar4.pi_ = extraout_RDX_00;
  }
  else {
    sVar1 = FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
            ::size((FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
                    *)0x8d0a3d);
    if (sVar1 == 0) {
      uVar2 = __cxa_allocate_exception(0x28);
      E::E(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      __cxa_throw(uVar2,&E::typeinfo,E::~E);
    }
    this_00 = FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
              ::top((FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
                     *)0x8d0a51);
    boost::shared_ptr<JPPVValuePair>::operator->(this_00);
    sVar5 = JPPVValuePair::GetJPPV(in_stack_ffffffffffffff88);
    boost::shared_ptr<JointPolicy>::shared_ptr<JointPolicyPureVector>
              ((shared_ptr<JointPolicy> *)in_RDI,local_20,sVar5.pn.pi_.pi_);
    boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
              ((shared_ptr<JointPolicyPureVector> *)0x8d0a7f);
    sVar4.pi_ = extraout_RDX;
  }
  sVar6.pn.pi_ = sVar4.pi_;
  sVar6.px = in_RDI;
  return sVar6;
}

Assistant:

const boost::shared_ptr<JointPolicy> BGIPSolution::GetJointPolicy() const
{
    if(_m_useFixedCapacityPriorityQueue)
        if(_m_qFixedK.size() > 0)
            return(_m_qFixedK.top()->GetJPPV());
        else
            throw(E("BGIPSolution::GetJointPolicy - No solution left in fixed size queue"));
    else
        if(_m_qInfSize->size() > 0)
            return(_m_qInfSize->top()->GetJPPV());
        else
            throw(E("BGIPSolution::GetJointPolicy - No solution left in inf size queue"));
}